

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

bool __thiscall
irr::core::string<wchar_t>::equals_ignore_case(string<wchar_t> *this,string<wchar_t> *other)

{
  u32 uVar1;
  u32 uVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  bool bVar5;
  u32 i;
  wchar_t *array;
  u32 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_24;
  
  pwVar3 = c_str((string<wchar_t> *)0x3c389d);
  local_24 = 0;
  while( true ) {
    bVar5 = false;
    if (pwVar3[local_24] != L'\0') {
      pwVar4 = operator[]((string<wchar_t> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
      bVar5 = *pwVar4 != L'\0';
    }
    if (!bVar5) break;
    uVar1 = core::locale_lower(pwVar3[local_24]);
    pwVar4 = operator[]((string<wchar_t> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    uVar2 = core::locale_lower(*pwVar4);
    if (uVar1 != uVar2) {
      return false;
    }
    local_24 = local_24 + 1;
  }
  uVar1 = size((string<wchar_t> *)0x3c393a);
  uVar2 = size((string<wchar_t> *)0x3c3948);
  return uVar1 == uVar2;
}

Assistant:

bool equals_ignore_case(const string<T> &other) const
	{
		const T *array = c_str();
		for (u32 i = 0; array[i] && other[i]; ++i)
			if (locale_lower(array[i]) != locale_lower(other[i]))
				return false;

		return size() == other.size();
	}